

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

bool rsg::anon_unknown_0::hasDeclarableVars(VariableManager *varMgr)

{
  bool bVar1;
  reference ppVVar2;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_30;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_28;
  const_iterator i;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *liveVars;
  VariableManager *varMgr_local;
  
  i._M_current = (Variable **)VariableManager::getLiveVariables(varMgr);
  local_28._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                 ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)i._M_current);
  while( true ) {
    local_30._M_current =
         (Variable **)
         std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end(i._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    ppVVar2 = __gnu_cxx::
              __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
              ::operator*(&local_28);
    bVar1 = canDeclareVariable(*ppVVar2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
    ::operator++(&local_28,0);
  }
  return true;
}

Assistant:

bool hasDeclarableVars (const VariableManager& varMgr)
{
	const vector<Variable*>& liveVars = varMgr.getLiveVariables();
	for (vector<Variable*>::const_iterator i = liveVars.begin(); i != liveVars.end(); i++)
	{
		if (canDeclareVariable(*i))
			return true;
	}
	return false;
}